

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O3

void anon_unknown.dwarf_32b471::wheel(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  ushort uVar5;
  float fVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  float __y;
  float fVar12;
  float fVar13;
  float fVar14;
  
  if (0 < h) {
    fVar2 = (float)w * 0.5;
    fVar3 = (float)h * 0.5;
    fVar14 = fVar2;
    if (fVar3 <= fVar2) {
      fVar14 = fVar3;
    }
    lVar10 = 0;
    uVar11 = 0;
    do {
      if (0 < w) {
        __y = (float)(int)uVar11 - fVar3;
        uVar8 = 0;
        do {
          lVar9 = pixels->_sizeY * lVar10;
          fVar13 = (float)(int)uVar8 - fVar2;
          fVar12 = SQRT(fVar13 * fVar13 + __y * __y);
          pRVar1 = pixels->_data;
          if ((fVar14 < fVar12) || (fVar12 < 25.46479)) {
            *(undefined8 *)((long)&pRVar1[uVar8].r._h + lVar9) = 0x3800380038003800;
          }
          else {
            fVar13 = atan2f(__y,fVar13);
            fVar12 = sinf(fVar13 * 40.0 + fVar12 * 0.5);
            fVar12 = fVar12 * 0.5 + 0.5;
            fVar13 = fVar12 * 0.5 + 0.5;
            fVar6 = ABS(fVar13);
            uVar5 = (ushort)((uint)fVar13 >> 0x10) & 0x8000;
            if ((uint)fVar6 < 0x38800000) {
              if ((0x33000000 < (uint)fVar6) &&
                 (uVar7 = (uint)fVar6 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar6 >> 0x17),
                 uVar5 = uVar5 | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
                 0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
                uVar5 = uVar5 + 1;
              }
            }
            else if ((uint)fVar6 < 0x7f800000) {
              if ((uint)fVar6 < 0x477ff000) {
                uVar5 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >>
                                0xd) | uVar5;
              }
              else {
                uVar5 = uVar5 | 0x7c00;
              }
            }
            else {
              uVar5 = uVar5 | 0x7c00;
              if (fVar6 != INFINITY) {
                uVar7 = (uint)fVar6 >> 0xd & 0x3ff;
                uVar5 = uVar5 | (ushort)uVar7 | (ushort)(uVar7 == 0);
              }
            }
            *(ushort *)((long)&pRVar1[uVar8].r._h + lVar9) = uVar5;
            *(ushort *)((long)&pRVar1[uVar8].g._h + lVar9) = uVar5;
            *(ushort *)((long)&pRVar1[uVar8].b._h + lVar9) = uVar5;
            fVar12 = fVar12 * -0.5 + 0.5;
            fVar13 = ABS(fVar12);
            uVar5 = (ushort)((uint)fVar12 >> 0x10) & 0x8000;
            if ((uint)fVar13 < 0x38800000) {
              if ((0x33000000 < (uint)fVar13) &&
                 (uVar7 = (uint)fVar13 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar13 >> 0x17),
                 uVar5 = uVar5 | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
                 0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
                uVar5 = uVar5 + 1;
              }
            }
            else if ((uint)fVar13 < 0x7f800000) {
              if ((uint)fVar13 < 0x477ff000) {
                uVar5 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >>
                                0xd) | uVar5;
              }
              else {
                uVar5 = uVar5 | 0x7c00;
              }
            }
            else {
              uVar5 = uVar5 | 0x7c00;
              if (fVar13 != INFINITY) {
                uVar7 = (uint)fVar13 >> 0xd & 0x3ff;
                uVar5 = uVar5 | (ushort)uVar7 | (ushort)(uVar7 == 0);
              }
            }
            *(ushort *)((long)&pRVar1[uVar8].a._h + lVar9) = uVar5;
          }
          uVar8 = uVar8 + 1;
        } while ((uint)w != uVar8);
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar11 != (uint)h);
  }
  return;
}

Assistant:

void
wheel (Array2D<Rgba>& pixels, int w, int h)
{
    float n      = 40;
    float m      = 0.5;
    float radMin = 2 * n / M_PI;
    float xCen   = w * 0.5;
    float yCen   = h * 0.5;
    float radMax = (xCen < yCen) ? xCen : yCen;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];
            float rad =
                sqrt ((x - xCen) * (x - xCen) + (y - yCen) * (y - yCen));

            if (rad <= radMax && rad >= radMin)
            {
                float phi = atan2 (y - yCen, x - xCen);
                float c   = 0.5 + 0.5 * sin (phi * n + rad * m);

                p.r = 0.5 + 0.5 * c;
                p.g = p.r;
                p.b = p.r;
                p.a = 0.5 - 0.5 * c;
            }
            else
            {
                p.r = 0.5;
                p.g = p.r;
                p.b = p.r;
                p.a = p.r;
            }
        }
    }
}